

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O0

int __thiscall
OSSLEDDSA::verify(OSSLEDDSA *this,PublicKey *publicKey,ByteString *originalData,
                 ByteString *signature,Type mechanism,void *param_5,size_t param_6)

{
  uint uVar1;
  int iVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  EVP_PKEY *pkey_00;
  undefined8 extraout_RAX_01;
  undefined4 extraout_var;
  undefined8 extraout_RAX_02;
  size_t sVar3;
  size_t sVar4;
  undefined8 extraout_RAX_03;
  EVP_MD_CTX *ctx_00;
  ulong uVar5;
  undefined8 uVar6;
  uchar *puVar7;
  uchar *puVar8;
  int ret;
  EVP_MD_CTX *ctx;
  size_t len;
  EVP_PKEY *pkey;
  OSSLEDPublicKey *pk;
  ByteString *in_stack_ffffffffffffff78;
  OSSLEDPublicKey *in_stack_ffffffffffffff80;
  EVP_MD_CTX *pEVar9;
  undefined1 local_1;
  
  if (mechanism == EDDSA) {
    uVar1 = (*(publicKey->super_Serialisable)._vptr_Serialisable[3])
                      (publicKey,OSSLEDPublicKey::type);
    if ((uVar1 & 1) == 0) {
      softHSMLog(3,"verify",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                 ,0x8c,"Invalid key type supplied");
      local_1 = 0;
      uVar6 = extraout_RAX_00;
    }
    else {
      pkey_00 = (EVP_PKEY *)OSSLEDPublicKey::getOSSLKey(in_stack_ffffffffffffff80);
      if (pkey_00 == (EVP_PKEY *)0x0) {
        softHSMLog(3,"verify",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                   ,0x96,"Could not get the OpenSSL public key");
        local_1 = 0;
        uVar6 = extraout_RAX_01;
      }
      else {
        iVar2 = (*(publicKey->super_Serialisable)._vptr_Serialisable[6])();
        if (CONCAT44(extraout_var,iVar2) == 0) {
          softHSMLog(3,"verify",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                     ,0x9f,"Could not get the order length");
          local_1 = 0;
          uVar6 = extraout_RAX_02;
        }
        else {
          sVar3 = CONCAT44(extraout_var,iVar2) << 1;
          sVar4 = ByteString::size((ByteString *)0x12ddde);
          if (sVar4 == sVar3) {
            ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
            iVar2 = EVP_DigestVerifyInit
                              (ctx_00,(EVP_PKEY_CTX **)0x0,(EVP_MD *)0x0,(ENGINE *)0x0,pkey_00);
            if (iVar2 == 0) {
              uVar5 = ERR_get_error();
              softHSMLog(3,"verify",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                         ,0xab,"EDDSA verify init failed (0x%08X)",uVar5);
              uVar6 = EVP_MD_CTX_free(ctx_00);
              local_1 = 0;
            }
            else {
              pEVar9 = ctx_00;
              puVar7 = ByteString::const_byte_str(in_stack_ffffffffffffff78);
              puVar8 = ByteString::const_byte_str(in_stack_ffffffffffffff78);
              sVar4 = ByteString::size((ByteString *)0x12dec1);
              iVar2 = EVP_DigestVerify(pEVar9,puVar7,sVar3,puVar8,sVar4);
              if (iVar2 == 1) {
                uVar6 = EVP_MD_CTX_free(ctx_00);
                local_1 = 1;
              }
              else {
                if (iVar2 < 0) {
                  uVar5 = ERR_get_error();
                  softHSMLog(3,"verify",
                             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                             ,0xb3,"EDDSA verify failed (0x%08X)",uVar5);
                }
                uVar6 = EVP_MD_CTX_free(ctx_00);
                local_1 = 0;
              }
            }
          }
          else {
            softHSMLog(3,"verify",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                       ,0xa5,"Invalid buffer length");
            local_1 = 0;
            uVar6 = extraout_RAX_03;
          }
        }
      }
    }
  }
  else {
    softHSMLog(3,"verify",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
               ,0x85,"Invalid mechanism supplied (%i)",(ulong)mechanism);
    local_1 = 0;
    uVar6 = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)uVar6 >> 8),local_1);
}

Assistant:

bool OSSLEDDSA::verify(PublicKey* publicKey, const ByteString& originalData,
		       const ByteString& signature, const AsymMech::Type mechanism,
		       const void* /* param = NULL */, const size_t /* paramLen = 0 */)
{
	if (mechanism != AsymMech::EDDSA)
	{
		ERROR_MSG("Invalid mechanism supplied (%i)", mechanism);
		return false;
	}

	// Check if the private key is the right type
	if (!publicKey->isOfType(OSSLEDPublicKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		return false;
	}

	OSSLEDPublicKey* pk = (OSSLEDPublicKey*) publicKey;
	EVP_PKEY* pkey = pk->getOSSLKey();

	if (pkey == NULL)
	{
		ERROR_MSG("Could not get the OpenSSL public key");

		return false;
	}

	// Perform the verify operation
	size_t len = pk->getOrderLength();
	if (len == 0)
	{
		ERROR_MSG("Could not get the order length");
		return false;
	}
	len *= 2;
	if (signature.size() != len)
	{
		ERROR_MSG("Invalid buffer length");
		return false;
	}
	EVP_MD_CTX* ctx = EVP_MD_CTX_new();
	if (!EVP_DigestVerifyInit(ctx, NULL, NULL, NULL, pkey))
	{
		ERROR_MSG("EDDSA verify init failed (0x%08X)", ERR_get_error());
		EVP_MD_CTX_free(ctx);
		return false;
	}
	int ret = EVP_DigestVerify(ctx, signature.const_byte_str(), len, originalData.const_byte_str(), originalData.size());
	if (ret != 1)
	{
		if (ret < 0)
			ERROR_MSG("EDDSA verify failed (0x%08X)", ERR_get_error());
		EVP_MD_CTX_free(ctx);
		return false;
	}
	EVP_MD_CTX_free(ctx);
	return true;
}